

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCodeExprList(Parse *pParse,ExprList *pList,int target,int srcReg,u8 flags)

{
  char cVar1;
  int iVar2;
  undefined4 in_ECX;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  byte in_R8B;
  VdbeOp *pOp;
  int inReg;
  Expr *pExpr;
  Vdbe *v;
  u8 copyOp;
  int n;
  int j;
  int i;
  ExprList_item *pItem;
  int in_stack_0000017c;
  Expr *in_stack_00000180;
  Parse *in_stack_00000188;
  Expr *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_34;
  int local_2c;
  int *piVar3;
  undefined7 in_stack_ffffffffffffffe0;
  
  cVar1 = 'Q';
  if ((in_R8B & 1) != 0) {
    cVar1 = 'P';
  }
  local_34 = *in_RSI;
  if (*(char *)(in_RDI + 0x23) == '\0') {
    in_R8B = in_R8B & 0xfd;
  }
  piVar3 = in_RSI + 2;
  for (local_2c = 0; local_2c < local_34; local_2c = local_2c + 1) {
    if (((in_R8B & 4) == 0) || ((short)piVar3[5] == 0)) {
      if (((in_R8B & 2) == 0) ||
         (iVar2 = sqlite3ExprIsConstantNotJoin
                            ((Parse *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffa8), iVar2 == 0)) {
        in_stack_ffffffffffffffb4 =
             sqlite3ExprCodeTarget(in_stack_00000188,in_stack_00000180,in_stack_0000017c);
        if (in_stack_ffffffffffffffb4 != in_EDX + local_2c) {
          in_stack_ffffffffffffffa8 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
          if ((((cVar1 == 'P') &&
               (in_stack_ffffffffffffffa8 = (Expr *)sqlite3VdbeGetLastOp((Vdbe *)0x1ccc1a),
               in_stack_ffffffffffffffa8->op == 'P')) &&
              (in_stack_ffffffffffffffa8->flags + *(int *)((long)&in_stack_ffffffffffffffa8->u + 4)
               + 1 == in_stack_ffffffffffffffb4)) &&
             (((in_stack_ffffffffffffffa8->u).iValue +
               *(int *)((long)&in_stack_ffffffffffffffa8->u + 4) + 1 == in_EDX + local_2c &&
              (*(u16 *)&in_stack_ffffffffffffffa8->op2 == 0)))) {
            *(int *)((long)&in_stack_ffffffffffffffa8->u + 4) =
                 *(int *)((long)&in_stack_ffffffffffffffa8->u + 4) + 1;
          }
          else {
            sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                              (int)in_stack_ffffffffffffffa8,0);
          }
        }
      }
      else {
        sqlite3ExprCodeRunJustOnce
                  ((Parse *)CONCAT44(in_EDX,in_ECX),
                   (Expr *)CONCAT17(in_R8B,in_stack_ffffffffffffffe0),(int)((ulong)piVar3 >> 0x20));
      }
    }
    else if ((in_R8B & 8) == 0) {
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                        (int)in_stack_ffffffffffffffa8,0);
    }
    else {
      local_2c = local_2c + -1;
      local_34 = local_34 + -1;
    }
    piVar3 = piVar3 + 6;
  }
  return local_34;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeExprList(
  Parse *pParse,     /* Parsing context */
  ExprList *pList,   /* The expression list to be coded */
  int target,        /* Where to write results */
  int srcReg,        /* Source registers if SQLITE_ECEL_REF */
  u8 flags           /* SQLITE_ECEL_* flags */
){
  struct ExprList_item *pItem;
  int i, j, n;
  u8 copyOp = (flags & SQLITE_ECEL_DUP) ? OP_Copy : OP_SCopy;
  Vdbe *v = pParse->pVdbe;
  assert( pList!=0 );
  assert( target>0 );
  assert( pParse->pVdbe!=0 );  /* Never gets this far otherwise */
  n = pList->nExpr;
  if( !ConstFactorOk(pParse) ) flags &= ~SQLITE_ECEL_FACTOR;
  for(pItem=pList->a, i=0; i<n; i++, pItem++){
    Expr *pExpr = pItem->pExpr;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( pItem->fg.bSorterRef ){
      i--;
      n--;
    }else
#endif
    if( (flags & SQLITE_ECEL_REF)!=0 && (j = pItem->u.x.iOrderByCol)>0 ){
      if( flags & SQLITE_ECEL_OMITREF ){
        i--;
        n--;
      }else{
        sqlite3VdbeAddOp2(v, copyOp, j+srcReg-1, target+i);
      }
    }else if( (flags & SQLITE_ECEL_FACTOR)!=0
           && sqlite3ExprIsConstantNotJoin(pParse,pExpr)
    ){
      sqlite3ExprCodeRunJustOnce(pParse, pExpr, target+i);
    }else{
      int inReg = sqlite3ExprCodeTarget(pParse, pExpr, target+i);
      if( inReg!=target+i ){
        VdbeOp *pOp;
        if( copyOp==OP_Copy
         && (pOp=sqlite3VdbeGetLastOp(v))->opcode==OP_Copy
         && pOp->p1+pOp->p3+1==inReg
         && pOp->p2+pOp->p3+1==target+i
         && pOp->p5==0  /* The do-not-merge flag must be clear */
        ){
          pOp->p3++;
        }else{
          sqlite3VdbeAddOp2(v, copyOp, inReg, target+i);
        }
      }
    }
  }
  return n;
}